

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedTest.cpp
# Opt level: O2

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::TimedTest::result(TimedTest *this)

{
  undefined1 auVar1 [8];
  long lVar2;
  pointer *__ptr;
  long in_RSI;
  shared_ptr<const_oout::Result> result;
  undefined1 local_38 [8];
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  long local_20;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  (**(code **)(**(long **)(in_RSI + 8) + 0x10))(local_38);
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::Result_const,std::default_delete<oout::Result_const>,void>
            ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)local_38);
  if (local_38 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_38)[1])();
  }
  local_20 = std::chrono::_V2::system_clock::now();
  local_20 = local_20 - lVar2;
  std::
  make_unique<oout::TimedResult_const,std::shared_ptr<oout::Result_const>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((shared_ptr<const_oout::Result> *)local_38,&local_30);
  auVar1 = local_38;
  local_38 = (undefined1  [8])0x0;
  (this->super_Test)._vptr_Test = (_func_int **)auVar1;
  std::unique_ptr<const_oout::TimedResult,_std::default_delete<const_oout::TimedResult>_>::
  ~unique_ptr((unique_ptr<const_oout::TimedResult,_std::default_delete<const_oout::TimedResult>_> *)
              local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> TimedTest::result() const
{
	const auto begin = chrono::high_resolution_clock::now();
	const shared_ptr<const Result> result = test->result();
	const auto end = chrono::high_resolution_clock::now();
	return make_unique<const TimedResult>(result, end - begin);
}